

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_plague(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  uint uVar2;
  char *format;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  if ((*(byte *)((long)vo + 0x1b2) & 1) != 0) {
    return;
  }
  bVar1 = saves_spell(level,(CHAR_DATA *)vo,0xd);
  if ((!bVar1) &&
     (((bVar1 = is_npc((CHAR_DATA *)vo), !bVar1 || ((*(byte *)((long)vo + 0x181) & 0x40) == 0)) &&
      (bVar1 = is_affected_by((CHAR_DATA *)vo,0x17), !bVar1)))) {
    init_affect(&AStack_88);
    AStack_88.where = 0;
    AStack_88.aftype = 3;
    AStack_88.type = gsn_plague;
    uVar2 = level * 3 + 3;
    if (-1 < level * 3) {
      uVar2 = level * 3;
    }
    AStack_88.level = (short)(uVar2 >> 2);
    AStack_88.duration = (short)(level / 3);
    AStack_88.location = 1;
    AStack_88.modifier = -5;
    AStack_88.bitvector[0]._2_1_ = AStack_88.bitvector[0]._2_1_ | 0x80;
    AStack_88.tick_fun = plague_tick;
    AStack_88.end_fun = (AFF_FUN *)0x0;
    AStack_88.owner = ch;
    new_affect_join((CHAR_DATA *)vo,&AStack_88);
    send_to_char("You scream in agony as plague sores erupt from your skin.\n\r",(CHAR_DATA *)vo);
    act("$n screams in agony as plague sores erupt from $s skin.",(CHAR_DATA *)vo,(void *)0x0,
        (void *)0x0,0);
    return;
  }
  bVar1 = ch == (CHAR_DATA *)vo;
  if (bVar1) {
    act("A sudden fever washes over you, but it passes.",ch,(void *)0x0,(void *)0x0,3);
    format = "$n looks flushed for a moment, but it passes.";
    vo = (void *)0x0;
  }
  else {
    act("$N resists the disease.",ch,(void *)0x0,vo,3);
    act("A sudden fever washes over you, but it passes.",ch,(void *)0x0,vo,2);
    format = "$N looks flushed for a moment, but it passes.";
  }
  act(format,ch,(void *)0x0,vo,(uint)!bVar1);
  return;
}

Assistant:

void spell_plague(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (IS_SET(victim->imm_flags, IMM_DISEASE))
		return;

	if (saves_spell(level, victim, DAM_DISEASE)
		|| (is_npc(victim) && IS_SET(victim->act, ACT_UNDEAD))
		|| is_affected_by(victim, AFF_PLAGUE))
	{
		if (ch == victim)
		{
			act("A sudden fever washes over you, but it passes.", ch, 0, 0, TO_CHAR);
			act("$n looks flushed for a moment, but it passes.", ch, 0, 0, TO_ROOM);
		}
		else
		{
			act("$N resists the disease.", ch, nullptr, victim, TO_CHAR);
			act("A sudden fever washes over you, but it passes.", ch, 0, victim, TO_VICT);
			act("$N looks flushed for a moment, but it passes.", ch, 0, victim, TO_NOTVICT);
		}

		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_MALADY;
	af.type = gsn_plague;
	af.level = level * 3 / 4;
	af.duration = level / 3;
	af.location = APPLY_STR;
	af.modifier = -5;

	SET_BIT(af.bitvector, AFF_PLAGUE);

	af.owner = ch;
	af.tick_fun = plague_tick;
	af.end_fun = nullptr;
	new_affect_join(victim, &af);

	send_to_char("You scream in agony as plague sores erupt from your skin.\n\r", victim);
	act("$n screams in agony as plague sores erupt from $s skin.", victim, nullptr, nullptr, TO_ROOM);
}